

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall TestAdsPerformance::Notifications(TestAdsPerformance *this,size_t numNotifications)

{
  undefined1 auVar1 [16];
  uint uVar2;
  ulong uVar3;
  uint *__p;
  type puVar4;
  long lVar5;
  bool condition;
  test_root local_f0;
  test_root local_d0;
  long local_b0;
  int local_a8 [2];
  duration<long,_std::ratio<1L,_1L>_> local_a0;
  test_root local_98;
  long local_78;
  int local_70;
  uint local_6c;
  undefined1 auStack_68 [4];
  uint32_t hUser;
  AdsNotificationAttrib attrib;
  unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_> notification;
  test_root local_40;
  long local_20;
  long port;
  size_t numNotifications_local;
  TestAdsPerformance *this_local;
  
  port = numNotifications;
  numNotifications_local = (size_t)this;
  local_20 = AdsPortOpenEx();
  condition = local_20 != 0;
  fructose::test_root::get_test_name_abi_cxx11_(&local_40);
  fructose::test_root::test_assert
            ((test_root *)this,condition,(string *)&local_40,"0 != port",
             "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp",
             0x38f);
  std::__cxx11::string::~string((string *)&local_40);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = port;
  uVar3 = SUB168(auVar1 * ZEXT816(4),0);
  if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  __p = (uint *)operator_new__(uVar3);
  std::unique_ptr<unsigned_int[],std::default_delete<unsigned_int[]>>::
  unique_ptr<unsigned_int*,std::default_delete<unsigned_int[]>,void,bool>
            ((unique_ptr<unsigned_int[],std::default_delete<unsigned_int[]>> *)&attrib.nMaxDelay,__p
            );
  auStack_68 = (undefined1  [4])0x1;
  hUser = 3;
  attrib.cbLength = 0;
  attrib.nTransMode = 1000000;
  for (local_6c = 0; lVar5 = local_20, uVar2 = local_6c, (ulong)local_6c < (ulong)port;
      local_6c = local_6c + 1) {
    local_70 = 0;
    puVar4 = std::unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>::operator[]
                       ((unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_> *)
                        &attrib.nMaxDelay,(ulong)local_6c);
    local_78 = AdsSyncAddDeviceNotificationReqEx
                         (lVar5,(AmsAddr *)&server,0x4020,4,(AdsNotificationAttrib *)auStack_68,
                          NotifyCallback,uVar2,puVar4);
    fructose::test_root::get_test_name_abi_cxx11_(&local_98);
    fructose::test_root::test_assert_eq<int,long>
              ((test_root *)this,&local_70,&local_78,(string *)&local_98,"0",
               "AdsSyncAddDeviceNotificationReqEx(port, &server, 0x4020, 4, &attrib, &NotifyCallback, hUser, &notification[hUser])"
               ,
               "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
               ,0x399);
    std::__cxx11::string::~string((string *)&local_98);
  }
  local_a8[1] = 5;
  std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>
            ((duration<long,std::ratio<1l,1l>> *)&local_a0,local_a8 + 1);
  std::this_thread::sleep_for<long,std::ratio<1l,1l>>(&local_a0);
  for (local_6c = 0; lVar5 = local_20, (ulong)local_6c < (ulong)port; local_6c = local_6c + 1) {
    local_a8[0] = 0;
    puVar4 = std::unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>::operator[]
                       ((unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_> *)
                        &attrib.nMaxDelay,(ulong)local_6c);
    local_b0 = AdsSyncDelDeviceNotificationReqEx(lVar5,(AmsAddr *)&server,*puVar4);
    fructose::test_root::get_test_name_abi_cxx11_(&local_d0);
    fructose::test_root::test_assert_eq<int,long>
              ((test_root *)this,local_a8,&local_b0,(string *)&local_d0,"0",
               "AdsSyncDelDeviceNotificationReqEx(port, &server, notification[hUser])",
               "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
               ,0x39d);
    std::__cxx11::string::~string((string *)&local_d0);
  }
  lVar5 = AdsPortCloseEx(local_20);
  fructose::test_root::get_test_name_abi_cxx11_(&local_f0);
  fructose::test_root::test_assert
            ((test_root *)this,lVar5 == 0,(string *)&local_f0,"0 == AdsPortCloseEx(port)",
             "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp",
             0x39f);
  std::__cxx11::string::~string((string *)&local_f0);
  std::unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>::~unique_ptr
            ((unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_> *)&attrib.nMaxDelay);
  return;
}

Assistant:

void Notifications(size_t numNotifications)
    {
        const long port = AdsPortOpenEx();
        fructose_assert(0 != port);

        const auto notification = std::unique_ptr<uint32_t[]>(new uint32_t[numNotifications]);
        AdsNotificationAttrib attrib = { 1, ADSTRANS_SERVERCYCLE, 0, {1000000} };
        uint32_t hUser = 0xDEADBEEF;

        for (hUser = 0; hUser < numNotifications; ++hUser) {
            fructose_assert_eq(0,
                               AdsSyncAddDeviceNotificationReqEx(port, &server, 0x4020, 4, &attrib, &NotifyCallback,
                                                                 hUser,
                                                                 &notification[hUser]));
        }
        std::this_thread::sleep_for(std::chrono::seconds(5));
        for (hUser = 0; hUser < numNotifications; ++hUser) {
            fructose_assert_eq(0, AdsSyncDelDeviceNotificationReqEx(port, &server, notification[hUser]));
        }
        fructose_assert(0 == AdsPortCloseEx(port));
    }